

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dist.hpp
# Opt level: O2

void gather_sim_result<PredictionData<double,long>,InputData<double,long>,WorkerMemory<ImputedData<long,double>,double,double>>
               (vector<WorkerForSimilarity,_std::allocator<WorkerForSimilarity>_> *worker_memory,
               vector<WorkerMemory<ImputedData<long,_double>,_double,_double>,_std::allocator<WorkerMemory<ImputedData<long,_double>,_double,_double>_>_>
               *worker_memory_m,PredictionData<double,_long> *prediction_data,
               InputData<double,_long> *input_data,IsoForest *model_outputs,
               ExtIsoForest *model_outputs_ext,double *tmat,double *rmat,size_t n_from,size_t ntrees
               ,bool assume_full_distr,bool standardize_dist,bool as_kernel,int nthreads)

{
  size_t *psVar1;
  ulong uVar2;
  ulong uVar3;
  pointer pWVar4;
  pointer pdVar5;
  pointer pWVar6;
  void *__src;
  size_t ix;
  size_t *psVar7;
  size_t sVar8;
  size_t ix_2;
  long lVar9;
  pointer __src_00;
  long lVar11;
  size_t ix_3;
  double dVar12;
  undefined1 auVar13 [16];
  double dVar14;
  ulong uVar10;
  
  if (interrupt_switch) {
    return;
  }
  psVar1 = &prediction_data->nrows;
  psVar7 = psVar1;
  if (prediction_data == (PredictionData<double,_long> *)0x0) {
    psVar7 = &input_data->nrows;
  }
  uVar3 = *psVar7;
  if ((uVar3 & 1) == 0) {
    uVar10 = uVar3 - 1;
    uVar2 = uVar3;
  }
  else {
    uVar2 = uVar3 - 1;
    uVar10 = uVar3;
  }
  lVar9 = uVar10 * (uVar2 >> 1);
  if (prediction_data == (PredictionData<double,_long> *)0x0) {
    lVar11 = 0;
  }
  else {
    lVar11 = *psVar1 - n_from;
  }
  if (worker_memory == (vector<WorkerForSimilarity,_std::allocator<WorkerForSimilarity>_> *)0x0) {
    pWVar6 = (worker_memory_m->
             super__Vector_base<WorkerMemory<ImputedData<long,_double>,_double,_double>,_std::allocator<WorkerMemory<ImputedData<long,_double>,_double,_double>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    __src_00 = (pWVar6->tmat_sep).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
    sVar8 = (long)*(pointer *)
                   ((long)&(pWVar6->tmat_sep).super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl + 8) - (long)__src_00;
    if (sVar8 == 0) goto LAB_001c1c4a;
  }
  else {
    pWVar4 = (worker_memory->
             super__Vector_base<WorkerForSimilarity,_std::allocator<WorkerForSimilarity>_>)._M_impl.
             super__Vector_impl_data._M_start;
    __src_00 = (pWVar4->tmat_sep).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
    pdVar5 = *(pointer *)
              ((long)&(pWVar4->tmat_sep).super__Vector_base<double,_std::allocator<double>_>._M_impl
              + 8);
    if (__src_00 == pdVar5) {
      __src = (pWVar4->rmat).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
      sVar8 = (long)*(pointer *)
                     ((long)&(pWVar4->rmat).super__Vector_base<double,_std::allocator<double>_>.
                             _M_impl + 8) - (long)__src;
      if (sVar8 != 0) {
        memcpy(rmat,__src,sVar8);
      }
      goto LAB_001c1c4a;
    }
    sVar8 = (long)pdVar5 - (long)__src_00;
  }
  memmove(tmat,__src_00,sVar8);
LAB_001c1c4a:
  auVar13._8_4_ = (int)(ntrees >> 0x20);
  auVar13._0_8_ = ntrees;
  auVar13._12_4_ = 0x45300000;
  dVar14 = (auVar13._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)ntrees) - 4503599627370496.0);
  if (standardize_dist) {
    if (as_kernel) {
      if (tmat == (double *)0x0) {
        for (lVar9 = 0; lVar11 * n_from - lVar9 != 0; lVar9 = lVar9 + 1) {
          rmat[lVar9] = rmat[lVar9] / dVar14;
        }
      }
      else {
        for (lVar11 = 0; lVar9 - lVar11 != 0; lVar11 = lVar11 + 1) {
          tmat[lVar11] = tmat[lVar11] / dVar14;
        }
      }
    }
    else {
      if (assume_full_distr) {
        dVar14 = dVar14 + dVar14;
      }
      else {
        if (input_data == (InputData<double,_long> *)0x0) {
          if (model_outputs != (IsoForest *)0x0) {
            model_outputs_ext = (ExtIsoForest *)model_outputs;
          }
          dVar12 = expected_separation_depth_hotstart
                             (model_outputs_ext->exp_avg_sep,model_outputs_ext->orig_sample_size,
                              *psVar1 + model_outputs_ext->orig_sample_size);
        }
        else {
          dVar12 = expected_separation_depth(input_data->nrows);
        }
        dVar14 = dVar14 * (dVar12 + -1.0);
      }
      if (tmat == (double *)0x0) {
        for (lVar9 = 0; lVar11 * n_from - lVar9 != 0; lVar9 = lVar9 + 1) {
          dVar12 = exp2(-rmat[lVar9] / dVar14);
          rmat[lVar9] = dVar12;
        }
      }
      else {
        for (lVar11 = 0; lVar9 - lVar11 != 0; lVar11 = lVar11 + 1) {
          dVar12 = exp2(-tmat[lVar11] / dVar14);
          tmat[lVar11] = dVar12;
        }
      }
    }
  }
  else if (!as_kernel) {
    if (tmat == (double *)0x0) {
      for (lVar9 = 0; lVar11 * n_from - lVar9 != 0; lVar9 = lVar9 + 1) {
        rmat[lVar9] = (rmat[lVar9] + dVar14) / dVar14;
      }
    }
    else {
      for (lVar11 = 0; lVar9 - lVar11 != 0; lVar11 = lVar11 + 1) {
        tmat[lVar11] = (tmat[lVar11] + dVar14) / dVar14;
      }
    }
  }
  return;
}

Assistant:

void gather_sim_result(std::vector<WorkerForSimilarity> *worker_memory,
                       std::vector<WorkerMemory> *worker_memory_m,
                       PredictionData *prediction_data, InputData *input_data,
                       IsoForest *model_outputs, ExtIsoForest *model_outputs_ext,
                       double *restrict tmat, double *restrict rmat, size_t n_from,
                       size_t ntrees, bool assume_full_distr,
                       bool standardize_dist, bool as_kernel, int nthreads)
{
    if (interrupt_switch)
        return;

    size_t nrows = (prediction_data != NULL)? prediction_data->nrows : input_data->nrows;
    size_t ncomb = calc_ncomb(nrows);
    size_t n_to  = (prediction_data != NULL)? (prediction_data->nrows - n_from) : 0;

    #ifdef _OPENMP
    if (nthreads > 1)
    {
        if (worker_memory != NULL)
        {
            for (WorkerForSimilarity &w : *worker_memory)
            {
                if (!w.tmat_sep.empty())
                {
                    #pragma omp parallel for schedule(static) num_threads(nthreads) shared(ncomb, tmat, w, worker_memory)
                    for (size_t_for ix = 0; ix < (decltype(ix))ncomb; ix++)
                        tmat[ix] += w.tmat_sep[ix];
                }
                else if (!w.rmat.empty())
                {
                    #pragma omp parallel for schedule(static) num_threads(nthreads) shared(rmat, w, worker_memory)
                    for (size_t_for ix = 0; ix < (decltype(ix))w.rmat.size(); ix++)
                        rmat[ix] += w.rmat[ix];
                }
            }
        }

        else
        {
            for (WorkerMemory &w : *worker_memory_m)
            {
                if (!w.tmat_sep.empty())
                {
                    #pragma omp parallel for schedule(static) num_threads(nthreads) shared(ncomb, tmat, w, worker_memory_m)
                    for (size_t_for ix = 0; ix < (decltype(ix))ncomb; ix++)
                        tmat[ix] += w.tmat_sep[ix];
                }
            }
        }
    }
    
    else
    #endif
    {
        if (worker_memory != NULL)
        {
            if (!(*worker_memory)[0].tmat_sep.empty())
                std::copy((*worker_memory)[0].tmat_sep.begin(), (*worker_memory)[0].tmat_sep.end(), tmat);
            else
                std::copy((*worker_memory)[0].rmat.begin(), (*worker_memory)[0].rmat.end(), rmat);
        }
        
        else
        {
            std::copy((*worker_memory_m)[0].tmat_sep.begin(), (*worker_memory_m)[0].tmat_sep.end(), tmat);
        }
    }

    double ntrees_dbl = (double) ntrees;
    if (standardize_dist)
    {
        if (as_kernel)
        {
            if (tmat != NULL)
                for (size_t ix = 0; ix < ncomb; ix++)
                    tmat[ix] /= ntrees_dbl;
            else
                for (size_t ix = 0; ix < (n_from * n_to); ix++)
                    rmat[ix] /= ntrees_dbl;
            return;
        }


        /* Note: the separation distances up this point are missing the first hop, which is always
           a +1 to every combination. Thus, it needs to be added back for the average separation depth.
           For the standardized metric, it takes the expected divisor as 2(=3-1) instead of 3, given
           that every combination will always get a +1 at the beginning. Since what's obtained here
           is a sum across all trees, adding this +1 means adding the number of trees. */
        double div_trees = ntrees_dbl;
        if (assume_full_distr)
        {
            div_trees *= 2;
        }

        else if (input_data != NULL)
        {
            div_trees *= (expected_separation_depth(input_data->nrows) - 1);
        }

        else
        {
            div_trees *= ((
                               (model_outputs != NULL)?
                                expected_separation_depth_hotstart(model_outputs->exp_avg_sep,
                                                                    model_outputs->orig_sample_size,
                                                                    model_outputs->orig_sample_size + prediction_data->nrows)
                                    :
                                expected_separation_depth_hotstart(model_outputs_ext->exp_avg_sep,
                                                                    model_outputs_ext->orig_sample_size,
                                                                    model_outputs_ext->orig_sample_size + prediction_data->nrows)
                          ) - 1);
        }

        
        if (tmat != NULL)
            #ifndef _WIN32
            #pragma omp simd
            #endif
            for (size_t ix = 0; ix < ncomb; ix++)
                tmat[ix] = std::exp2( - tmat[ix] / div_trees);
        else
            #ifndef _WIN32
            #pragma omp simd
            #endif
            for (size_t ix = 0; ix < (n_from * n_to); ix++)
                rmat[ix] = std::exp2( - rmat[ix] / div_trees);
    }
    
    else
    {
        if (as_kernel) return;

        if (tmat != NULL)
            #ifndef _WIN32
            #pragma omp simd
            #endif
            for (size_t ix = 0; ix < ncomb; ix++)
                tmat[ix] = (tmat[ix] + ntrees) / ntrees_dbl;
        else
            #ifndef _WIN32
            #pragma omp simd
            #endif
            for (size_t ix = 0; ix < (n_from * n_to); ix++)
                rmat[ix] = (rmat[ix] + ntrees) / ntrees_dbl;
    }
}